

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O2

uchar * duckdb_shell_sqlite3_value_text(sqlite3_value *pVal)

{
  SQLiteTypeValue SVar1;
  bool bVar2;
  string *value_00;
  uchar *puVar3;
  string_t local_98;
  anon_union_16_2_67f50693_for_value in_stack_ffffffffffffff80;
  Value value;
  
  if (pVal != (sqlite3_value *)0x0) {
    SVar1 = pVal->type;
    if (SVar1 - 1 < 2) {
      if (SVar1 == INTEGER) {
        duckdb::Value::BIGINT(&value,(pVal->u).i);
      }
      else {
        duckdb::Value::DOUBLE(&value,(pVal->u).r);
      }
      duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff78,VARCHAR);
      bVar2 = duckdb::Value::DefaultTryCastAs(&value,(LogicalType *)&stack0xffffffffffffff78,false);
      duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffff78);
      if (bVar2) {
        value_00 = duckdb::StringValue::Get_abi_cxx11_(&value);
        duckdb::string_t::string_t(&local_98,value_00);
        duckdb::CastToSQLiteValue::Operation<duckdb::string_t>((string_t)in_stack_ffffffffffffff80);
        sqlite3_value::operator=(pVal,(sqlite3_value *)&stack0xffffffffffffff78);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
        puVar3 = (uchar *)(pVal->str)._M_dataplus._M_p;
      }
      else {
        pVal->db->errCode = 7;
        puVar3 = (uchar *)0x0;
      }
      duckdb::Value::~Value(&value);
      return puVar3;
    }
    if (SVar1 - 3 < 2) {
      return (uchar *)(pVal->str)._M_dataplus._M_p;
    }
    if (SVar1 != NULL_VALUE) {
      pVal->db->errCode = 0x14;
    }
  }
  return (uchar *)0x0;
}

Assistant:

const unsigned char *sqlite3_value_text(sqlite3_value *pVal) {
	if (!pVal) {
		return nullptr;
	}
	if (pVal->type == SQLiteTypeValue::TEXT || pVal->type == SQLiteTypeValue::BLOB) {
		return (const unsigned char *)pVal->str.c_str();
	}

	if (pVal->type == SQLiteTypeValue::INTEGER || pVal->type == SQLiteTypeValue::FLOAT) {
		Value value = (pVal->type == SQLiteTypeValue::INTEGER) ? Value::BIGINT(pVal->u.i) : Value::DOUBLE(pVal->u.r);
		if (!value.DefaultTryCastAs(LogicalType::VARCHAR)) {
			pVal->db->errCode = SQLITE_NOMEM;
			return nullptr;
		}
		auto &str_val = StringValue::Get(value);
		*pVal = CastToSQLiteValue::Operation<string_t>(string_t(str_val));
		return (const unsigned char *)pVal->str.c_str();
	}
	if (pVal->type == SQLiteTypeValue::NULL_VALUE) {
		return nullptr;
	}
	pVal->db->errCode = SQLITE_MISMATCH;
	return nullptr;
}